

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall xmrig::Pool::Pool(Pool *this,char *url)

{
  undefined4 *in_RDI;
  Url *this_00;
  unsigned_long_long in_stack_ffffffffffffffb8;
  bitset<2UL> *in_stack_ffffffffffffffc0;
  String *this_01;
  Url *this_02;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::bitset<2UL>::bitset(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (Url *)(in_RDI + 4);
  String::String((String *)this_00);
  String::String((String *)(in_RDI + 8));
  String::String((String *)(in_RDI + 0xc));
  this_01 = (String *)(in_RDI + 0x10);
  String::String(this_01);
  *(undefined8 *)(in_RDI + 0x14) = 1000;
  this_02 = (Url *)(in_RDI + 0x16);
  Url::Url(this_00);
  Url::Url(this_02,(char *)this_01);
  return;
}

Assistant:

xmrig::Pool::Pool(const char *url) :
    m_flags(1 << FLAG_ENABLED),
    m_pollInterval(kDefaultPollInterval),
    m_url(url)
{
}